

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  size_type sVar1;
  const_pointer pcVar2;
  const_iterator pcVar3;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  char *it;
  bool bVar4;
  size_type local_48;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> v_local;
  
  v_local.data_ = (const_pointer)v.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)v.data_;
  sVar1 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  bVar4 = true;
  if (sVar1 != 0) {
    pcVar2 = data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    bVar4 = pcVar2 != (const_pointer)0x0;
  }
  if (!bVar4) {
    __assert_fail("v.size() == 0 || v.data() != nssv_nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/inja.hpp"
                  ,0x292,
                  "size_type nonstd::sv_lite::basic_string_view<char>::find(basic_string_view<CharT, Traits>, size_type) const [CharT = char, Traits = std::char_traits<char>]"
                 );
  }
  sVar1 = size(this);
  if (pos < sVar1) {
    pcVar3 = cbegin(this);
    __last1 = cend(this);
    __first2 = cbegin((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __last2 = cend((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    it = std::search<char_const*,char_const*,bool(*)(char_const&,char_const&)>
                   (pcVar3 + pos,__last1,__first2,__last2,std::char_traits<char>::eq);
    local_48 = to_pos(this,it);
  }
  else {
    local_48 = 0xffffffffffffffff;
  }
  return local_48;
}

Assistant:

nssv_constexpr14 size_type find(basic_string_view v, size_type pos = 0) const nssv_noexcept  // (1)
		{
			return assert(v.size() == 0 || v.data() != nssv_nullptr),
				   pos >= size() ? npos : to_pos(std::search(cbegin() + pos, cend(), v.cbegin(), v.cend(), Traits::eq));
		}